

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

void google::protobuf::Int64Value::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Int64Value **v1;
  Int64Value **v2;
  LogMessage *pLVar1;
  int64_t iVar2;
  undefined1 auVar3 [16];
  uint32_t cached_has_bits;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  Int64Value *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  Int64Value *from;
  Int64Value *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (Int64Value *)from_msg;
  absl_log_internal_check_op_result = (string *)from_msg;
  from = (Int64Value *)to_msg;
  _this = (Int64Value *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Int64Value_const*>
                 (&local_38);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Int64Value*>(&from)
  ;
  local_30 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::Int64Value_const*,google::protobuf::Int64Value*>
                       (v1,v2,"&from != _this");
  if (local_30 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/wrappers.pb.cc"
               ,999,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  iVar2 = _internal_value((Int64Value *)absl_log_internal_check_op_result);
  if (iVar2 != 0) {
    (from->field_0)._impl_.value_ =
         (absl_log_internal_check_op_result->field_2)._M_allocated_capacity;
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&absl_log_internal_check_op_result->_M_string_length);
  return;
}

Assistant:

void Int64Value::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Int64Value*>(&to_msg);
  auto& from = static_cast<const Int64Value&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Int64Value)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_value() != 0) {
    _this->_impl_.value_ = from._impl_.value_;
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}